

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void lm_trie_alloc_ngram(lm_trie_t *trie,uint32 *counts,int order)

{
  void *base_mem;
  uint8 uVar1;
  uint32 uVar2;
  uint8 *puVar3;
  middle_t *pmVar4;
  void *ptr;
  longest_t *plVar5;
  middle_t *local_60;
  middle_t *middle_ptr;
  uint8 **middle_starts;
  uint8 *mem_ptr;
  int i;
  int order_local;
  uint32 *counts_local;
  lm_trie_t *trie_local;
  
  trie->ngram_mem_size = 0;
  for (mem_ptr._0_4_ = 1; (int)mem_ptr < order + -1; mem_ptr._0_4_ = (int)mem_ptr + 1) {
    uVar1 = lm_trie_quant_msize(trie->quant);
    uVar2 = middle_size(uVar1,counts[(int)mem_ptr],*counts,counts[(int)mem_ptr + 1]);
    trie->ngram_mem_size = (ulong)uVar2 + trie->ngram_mem_size;
  }
  uVar1 = lm_trie_quant_lsize(trie->quant);
  uVar2 = longest_size(uVar1,counts[order + -1],*counts);
  trie->ngram_mem_size = (ulong)uVar2 + trie->ngram_mem_size;
  puVar3 = (uint8 *)__ckd_calloc__(trie->ngram_mem_size,1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                   ,0x1e2);
  trie->ngram_mem = puVar3;
  middle_starts = (uint8 **)trie->ngram_mem;
  pmVar4 = (middle_t *)
           __ckd_calloc__((long)(order + -2),0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x1e5);
  trie->middle_begin = pmVar4;
  trie->middle_end = trie->middle_begin + (order + -2);
  ptr = __ckd_calloc__((long)(order + -2),8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                       ,0x1e8);
  for (mem_ptr._0_4_ = 2; (int)mem_ptr < order; mem_ptr._0_4_ = (int)mem_ptr + 1) {
    *(uint8 ***)((long)ptr + (long)((int)mem_ptr + -2) * 8) = middle_starts;
    uVar1 = lm_trie_quant_msize(trie->quant);
    uVar2 = middle_size(uVar1,counts[(int)mem_ptr + -1],*counts,counts[(int)mem_ptr]);
    middle_starts = (uint8 **)((long)middle_starts + (ulong)uVar2);
  }
  plVar5 = (longest_t *)
           __ckd_calloc__(1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x1ef);
  trie->longest = plVar5;
  for (mem_ptr._0_4_ = order + -1; 1 < (int)mem_ptr; mem_ptr._0_4_ = (int)mem_ptr + -1) {
    pmVar4 = trie->middle_begin;
    base_mem = *(void **)((long)ptr + (long)((int)mem_ptr + -2) * 8);
    uVar1 = lm_trie_quant_msize(trie->quant);
    if ((int)mem_ptr == order + -1) {
      local_60 = (middle_t *)trie->longest;
    }
    else {
      local_60 = trie->middle_begin + ((int)mem_ptr + -1);
    }
    middle_init(pmVar4 + ((int)mem_ptr + -2),base_mem,uVar1,counts[(int)mem_ptr + -1],*counts,
                counts[(int)mem_ptr],local_60);
  }
  ckd_free(ptr);
  plVar5 = trie->longest;
  uVar1 = lm_trie_quant_lsize(trie->quant);
  longest_init(plVar5,middle_starts,uVar1,*counts);
  return;
}

Assistant:

static void
lm_trie_alloc_ngram(lm_trie_t * trie, uint32 * counts, int order)
{
    int i;
    uint8 *mem_ptr;
    uint8 **middle_starts;

    trie->ngram_mem_size = 0;
    for (i = 1; i < order - 1; i++) {
        trie->ngram_mem_size +=
            middle_size(lm_trie_quant_msize(trie->quant), counts[i],
                        counts[0], counts[i + 1]);
    }
    trie->ngram_mem_size +=
        longest_size(lm_trie_quant_lsize(trie->quant), counts[order - 1],
                     counts[0]);
    trie->ngram_mem =
        (uint8 *) ckd_calloc(trie->ngram_mem_size,
                             sizeof(*trie->ngram_mem));
    mem_ptr = trie->ngram_mem;
    trie->middle_begin =
        (middle_t *) ckd_calloc(order - 2, sizeof(*trie->middle_begin));
    trie->middle_end = trie->middle_begin + (order - 2);
    middle_starts =
        (uint8 **) ckd_calloc(order - 2, sizeof(*middle_starts));
    for (i = 2; i < order; i++) {
        middle_starts[i - 2] = mem_ptr;
        mem_ptr +=
            middle_size(lm_trie_quant_msize(trie->quant), counts[i - 1],
                        counts[0], counts[i]);
    }
    trie->longest = (longest_t *) ckd_calloc(1, sizeof(*trie->longest));
    /* Crazy backwards thing so we initialize using pointers to ones that have already been initialized */
    for (i = order - 1; i >= 2; --i) {
        middle_t *middle_ptr = &trie->middle_begin[i - 2];
        middle_init(middle_ptr, middle_starts[i - 2],
                    lm_trie_quant_msize(trie->quant), counts[i - 1],
                    counts[0], counts[i],
                    (i ==
                     order -
                     1) ? (void *) trie->longest : (void *) &trie->
                    middle_begin[i - 1]);
    }
    ckd_free(middle_starts);
    longest_init(trie->longest, mem_ptr, lm_trie_quant_lsize(trie->quant),
                 counts[0]);
}